

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.h
# Opt level: O0

QImage * __thiscall QImage::convertToFormat(QImage *this,Format f,ImageConversionFlags flags)

{
  long lVar1;
  ulong uVar2;
  uint in_EDX;
  QFlags_conflict *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QImage *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = ::QImage::convertToFormat_inplace((Format)in_RSI,(QFlags_conflict *)(ulong)in_EDX);
  if ((uVar2 & 1) == 0) {
    ::QImage::convertToFormat_helper((Format)in_RDI,in_RSI);
  }
  else {
    QImage(this_00,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] QImage convertToFormat(Format f, Qt::ImageConversionFlags flags = Qt::AutoColor) &&
    {
        if (convertToFormat_inplace(f, flags))
            return std::move(*this);
        else
            return convertToFormat_helper(f, flags);
    }